

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  sockaddr_in sVar1;
  undefined1 local_b8 [8];
  sockaddr_in peerAddr;
  char msg [100];
  undefined1 local_38 [8];
  ServerService service;
  int size;
  int port;
  char **argv_local;
  int argc_local;
  
  service.serverSocketUDP._4_4_ = 0x1ed8;
  service.serverSocketUDP._0_4_ = 0x14;
  ServerService::ServerService((ServerService *)local_38,0x1ed8,0x14);
  builtin_memcpy(peerAddr.sin_zero,"BROADCAS",8);
  sVar1 = ServerService::initBroadcast((ServerService *)local_38,0x2329);
  peerAddr._0_8_ = sVar1.sin_zero;
  local_b8 = sVar1._0_8_;
  ServerService::startBroadcast
            ((ServerService *)local_38,(sockaddr_in *)local_b8,(char *)peerAddr.sin_zero,5);
  ServerService::startBroadcast
            ((ServerService *)local_38,(sockaddr_in *)local_b8,(char *)peerAddr.sin_zero,4);
  ServerService::startBroadcast
            ((ServerService *)local_38,(sockaddr_in *)local_b8,(char *)peerAddr.sin_zero,3);
  ServerService::startBroadcast
            ((ServerService *)local_38,(sockaddr_in *)local_b8,(char *)peerAddr.sin_zero,2);
  ServerService::startBroadcast
            ((ServerService *)local_38,(sockaddr_in *)local_b8,(char *)peerAddr.sin_zero,1);
  ServerService::startBroadcast
            ((ServerService *)local_38,(sockaddr_in *)local_b8,(char *)peerAddr.sin_zero,1);
  ServerService::startService((ServerService *)local_38);
  ServerService::~ServerService((ServerService *)local_38);
  return 0;
}

Assistant:

int main(int argc, char const *argv[]) {
    int port = 7896;
    int size = 20;
//    cout << "Please input port and window size:";
//    cin >> port >> size;
    ServerService service = ServerService(port, size);

    char msg[100] = "BROADCAST FROM SERVER";
    //初始化广播
    struct sockaddr_in peerAddr = service.initBroadcast(9001);
    //发送单条广播
    service.startBroadcast(&peerAddr, msg, 5);
    service.startBroadcast(&peerAddr, msg, 4);
    service.startBroadcast(&peerAddr, msg, 3);
    service.startBroadcast(&peerAddr, msg, 2);
    service.startBroadcast(&peerAddr, msg);
    service.startBroadcast(&peerAddr, msg);
    service.startService();
//    service.startControlService();
//    service.startControlServiceWithResult();
    return 0;
}